

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_enc_impl.cpp
# Opt level: O0

RK_S32 check_resend_hdr(MpiCmd cmd,void *param,MppEncCfgSet *cfg,RK_BOOL *encode_idr)

{
  uint uVar1;
  RK_S32 RVar2;
  RK_U32 check_flag_1;
  RK_U32 change_1;
  RK_U32 check_flag;
  RK_U32 change;
  RK_S32 resend;
  RK_BOOL *encode_idr_local;
  MppEncCfgSet *cfg_local;
  void *param_local;
  MpiCmd cmd_local;
  
  check_flag = 0;
  *encode_idr = RK_TRUE;
  if ((cfg->codec).coding == MPP_VIDEO_CodingMJPEG) {
    *encode_idr = RK_FALSE;
    param_local._4_4_ = 0;
  }
  else if (cmd == MPP_ENC_SET_IDR_FRAME) {
    param_local._4_4_ = 1;
  }
  else {
    if ((cmd == MPP_ENC_SET_CODEC_CFG) || (cmd == MPP_ENC_SET_PREP_CFG)) {
      check_flag = 1;
    }
    else if ((cmd == MPP_ENC_SET_RC_CFG) && ((*param & 0xc1) != 0)) {
      check_flag = 2;
      if (((cfg->rc).fps_chg_no_idr != 0) && ((*param & 0x40) != 0)) {
        *encode_idr = RK_FALSE;
      }
    }
    else if (cmd == MPP_ENC_SET_CFG) {
      if (((cfg->prep).change & 0xf0015) == 0) {
        uVar1 = (cfg->rc).change;
        if ((uVar1 & 0xc1) == 0) {
          RVar2 = check_codec_to_resend_hdr(&cfg->codec);
          if (RVar2 != 0) {
            check_flag = 5;
          }
        }
        else {
          check_flag = 4;
          if (((cfg->rc).fps_chg_no_idr != 0) && ((uVar1 & 0x40) != 0)) {
            *encode_idr = RK_FALSE;
          }
        }
      }
      else {
        check_flag = 3;
      }
    }
    if (check_flag == 0) {
      *encode_idr = RK_FALSE;
    }
    else if ((mpp_enc_debug & 0x20) != 0) {
      _mpp_log_l(4,"mpp_enc","send header for %s\n","check_resend_hdr",
                 check_resend_hdr::resend_reason[(int)check_flag]);
    }
    param_local._4_4_ = check_flag;
  }
  return param_local._4_4_;
}

Assistant:

static RK_S32 check_resend_hdr(MpiCmd cmd, void *param, MppEncCfgSet *cfg, RK_BOOL *encode_idr)
{
    RK_S32 resend = 0;
    static const char *resend_reason[] = {
        "unchanged",
        "codec/prep cfg change",
        "rc cfg change rc_mode/fps/gop",
        "set cfg change input/format/color",
        "set cfg change rc_mode/fps/gop",
        "set cfg change codec",
    };

    *encode_idr = RK_TRUE;

    if (cfg->codec.coding == MPP_VIDEO_CodingMJPEG) {
        *encode_idr = RK_FALSE;
        return 0;
    }

    do {
        if (cmd == MPP_ENC_SET_IDR_FRAME)
            return 1;

        if (cmd == MPP_ENC_SET_CODEC_CFG ||
            cmd == MPP_ENC_SET_PREP_CFG) {
            resend = 1;
            break;
        }

        if (cmd == MPP_ENC_SET_RC_CFG) {
            RK_U32 change = *(RK_U32 *)param;
            RK_U32 check_flag = MPP_ENC_RC_CFG_CHANGE_RC_MODE |
                                MPP_ENC_RC_CFG_CHANGE_FPS_OUT |
                                MPP_ENC_RC_CFG_CHANGE_GOP;

            if (change & check_flag) {
                resend = 2;

                if (cfg->rc.fps_chg_no_idr && (change & MPP_ENC_RC_CFG_CHANGE_FPS_OUT))
                    *encode_idr = RK_FALSE;

                break;
            }
        }

        if (cmd == MPP_ENC_SET_CFG) {
            RK_U32 change = cfg->prep.change;
            RK_U32 check_flag = MPP_ENC_PREP_CFG_CHANGE_INPUT |
                                MPP_ENC_PREP_CFG_CHANGE_FORMAT |
                                MPP_ENC_PREP_CFG_CHANGE_ROTATION |
                                MPP_ENC_PREP_CFG_CHANGE_COLOR_RANGE |
                                MPP_ENC_PREP_CFG_CHANGE_COLOR_SPACE |
                                MPP_ENC_PREP_CFG_CHANGE_COLOR_PRIME |
                                MPP_ENC_PREP_CFG_CHANGE_COLOR_TRC;

            if (change & check_flag) {
                resend = 3;
                break;
            }

            change = cfg->rc.change;
            check_flag = MPP_ENC_RC_CFG_CHANGE_RC_MODE |
                         MPP_ENC_RC_CFG_CHANGE_FPS_OUT |
                         MPP_ENC_RC_CFG_CHANGE_GOP;

            if (change & check_flag) {
                resend = 4;

                if (cfg->rc.fps_chg_no_idr && (change & MPP_ENC_RC_CFG_CHANGE_FPS_OUT))
                    *encode_idr = RK_FALSE;

                break;
            }
            if (check_codec_to_resend_hdr(&cfg->codec)) {
                resend = 5;
                break;
            }
        }
    } while (0);

    if (resend)
        enc_dbg_detail("send header for %s\n", resend_reason[resend]);
    else
        *encode_idr = RK_FALSE;

    return resend;
}